

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

engr * engr_at(level *lev,xchar x,xchar y)

{
  engr *local_28;
  engr *ep;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  local_28 = lev->lev_engr;
  while( true ) {
    if (local_28 == (engr *)0x0) {
      return (engr *)0x0;
    }
    if ((x == local_28->engr_x) && (y == local_28->engr_y)) break;
    local_28 = local_28->nxt_engr;
  }
  return local_28;
}

Assistant:

struct engr *engr_at(struct level *lev, xchar x, xchar y)
{
	struct engr *ep = lev->lev_engr;

	while (ep) {
		if (x == ep->engr_x && y == ep->engr_y)
			return ep;
		ep = ep->nxt_engr;
	}
	return NULL;
}